

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Hash_Blake2s.c
# Opt level: O0

void Hacl_Hash_Blake2s_finish(uint32_t nn,uint8_t *output,uint32_t *hash)

{
  __uint32_t _Var1;
  uint8_t *final;
  uint32_t i_1;
  uint32_t i;
  uint32_t *row1;
  uint32_t *row0;
  uint8_t *second;
  uint8_t *first;
  uint8_t b [32];
  uint32_t *hash_local;
  uint8_t *output_local;
  uint32_t nn_local;
  
  memset(&first,0,0x20);
  _Var1 = __uint32_identity(*hash);
  store32((uint8_t *)&first,_Var1);
  _Var1 = __uint32_identity(hash[1]);
  store32((uint8_t *)((long)&first + 4),_Var1);
  _Var1 = __uint32_identity(hash[2]);
  store32(b,_Var1);
  _Var1 = __uint32_identity(hash[3]);
  store32(b + 4,_Var1);
  _Var1 = __uint32_identity(hash[4]);
  store32(b + 8,_Var1);
  _Var1 = __uint32_identity(hash[5]);
  store32(b + 0xc,_Var1);
  _Var1 = __uint32_identity(hash[6]);
  store32(b + 0x10,_Var1);
  _Var1 = __uint32_identity(hash[7]);
  store32(b + 0x14,_Var1);
  memcpy(output,&first,(ulong)nn);
  Lib_Memzero0_memzero0(&first,0x20);
  return;
}

Assistant:

void Hacl_Hash_Blake2s_finish(uint32_t nn, uint8_t *output, uint32_t *hash)
{
  uint8_t b[32U] = { 0U };
  uint8_t *first = b;
  uint8_t *second = b + 16U;
  uint32_t *row0 = hash;
  uint32_t *row1 = hash + 4U;
  KRML_MAYBE_FOR4(i, 0U, 4U, 1U, store32_le(first + i * 4U, row0[i]););
  KRML_MAYBE_FOR4(i, 0U, 4U, 1U, store32_le(second + i * 4U, row1[i]););
  uint8_t *final = b;
  memcpy(output, final, nn * sizeof (uint8_t));
  Lib_Memzero0_memzero(b, 32U, uint8_t, void *);
}